

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3BeginTrigger(Parse *pParse,Token *pName1,Token *pName2,int tr_tm,int op,IdList *pColumns
                        ,SrcList *pTableName,Expr *pWhen,int isTemp,int noErr)

{
  sqlite3 *db;
  Db *pDVar1;
  char *zArg3;
  Token *pName_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  Table *pTVar5;
  char *zName;
  HashElem *pHVar6;
  Trigger *pTrigger;
  Expr *pEVar7;
  IdList *pIVar8;
  Schema **ppSVar9;
  char *pcVar10;
  char *zArg3_00;
  ulong uVar11;
  Token *pName;
  uint h;
  DbFixer sFix;
  Token *local_80;
  long local_78;
  Token *local_70;
  uint local_64;
  DbFixer local_60;
  
  db = pParse->db;
  if (isTemp == 0) {
    uVar2 = sqlite3TwoPartName(pParse,pName1,pName2,&local_80);
    uVar11 = (ulong)uVar2;
    if (pTableName == (SrcList *)0x0 || (int)uVar2 < 0) goto LAB_0014e807;
LAB_0014e73e:
    if (db->mallocFailed != '\0') goto LAB_0014e807;
    if (((int)uVar11 != 1) && ((db->init).busy != '\0')) {
      sqlite3DbFree(db,pTableName->a[0].zDatabase);
      pTableName->a[0].zDatabase = (char *)0x0;
    }
    pTVar5 = sqlite3SrcListLookup(pParse,pTableName);
    pName_00 = local_80;
    if ((((db->init).busy == '\0') && (pTVar5 != (Table *)0x0 && pName2->n == 0)) &&
       (pTVar5->pSchema == db->aDb[1].pSchema)) {
      uVar11 = 1;
    }
    if (db->mallocFailed != '\0') goto LAB_0014e807;
    pDVar1 = pParse->db->aDb;
    iVar4 = (int)uVar11;
    local_60.zDb = pDVar1[iVar4].zName;
    local_60.pSchema = pDVar1[iVar4].pSchema;
    local_60.zType = "trigger";
    local_60.pName = local_80;
    local_60.bVarOnly = (int)(iVar4 == 1);
    local_60.pParse = pParse;
    iVar3 = sqlite3FixSrcList(&local_60,pTableName);
    if (iVar3 != 0) goto LAB_0014e807;
    pTVar5 = sqlite3SrcListLookup(pParse,pTableName);
    if (pTVar5 == (Table *)0x0) {
      if ((db->init).iDb == '\x01') {
        (db->init).orphanTrigger = '\x01';
      }
      zName = (char *)0x0;
LAB_0014e938:
      pTrigger = (Trigger *)0x0;
      goto LAB_0014e810;
    }
    if ((pTVar5->tabFlags & 0x10) != 0) {
      pcVar10 = "cannot create triggers on virtual tables";
      goto LAB_0014e6d8;
    }
    local_70 = pName_00;
    zName = sqlite3NameFromToken(db,pName_00);
    if (zName == (char *)0x0) goto LAB_0014e807;
    iVar3 = sqlite3CheckObjectName(pParse,zName);
    if (iVar3 == 0) {
      pDVar1 = db->aDb;
      local_78 = uVar11 * 0x20;
      pHVar6 = findElementWithHash(&(pDVar1[uVar11].pSchema)->trigHash,zName,&local_64);
      if ((pHVar6 != (HashElem *)0x0) && (pHVar6->data != (void *)0x0)) {
        if (noErr == 0) {
          pTrigger = (Trigger *)0x0;
          sqlite3ErrorMsg(pParse,"trigger %T already exists",local_70);
          goto LAB_0014e810;
        }
        sqlite3CodeVerifySchema(pParse,iVar4);
        goto LAB_0014e938;
      }
      pcVar10 = pTVar5->zName;
      iVar3 = sqlite3_strnicmp(pcVar10,"sqlite_",7);
      if (iVar3 == 0) {
        sqlite3ErrorMsg(pParse,"cannot create trigger on system table");
        pParse->nErr = pParse->nErr + 1;
      }
      else if (tr_tm == 0x31 || pTVar5->pSelect == (Select *)0x0) {
        if (tr_tm == 0x31 && pTVar5->pSelect == (Select *)0x0) {
          sqlite3ErrorMsg(pParse,"cannot create INSTEAD OF trigger on table: %S",pTableName,0);
        }
        else {
          if (pTVar5->pSchema == (Schema *)0x0) {
            uVar11 = 0xfff0bdc0;
          }
          else {
            uVar2 = db->nDb;
            if ((int)uVar2 < 1) {
              uVar11 = 0;
            }
            else {
              ppSVar9 = &pDVar1->pSchema;
              uVar11 = 0;
              do {
                if (*ppSVar9 == pTVar5->pSchema) goto LAB_0014ea67;
                uVar11 = uVar11 + 1;
                ppSVar9 = ppSVar9 + 4;
              } while (uVar2 != uVar11);
              uVar11 = (ulong)uVar2;
            }
          }
LAB_0014ea67:
          iVar3 = (int)uVar11;
          zArg3 = pDVar1[iVar3].zName;
          zArg3_00 = zArg3;
          if (isTemp != 0) {
            zArg3_00 = pDVar1[1].zName;
          }
          iVar4 = 5;
          if (isTemp == 0) {
            iVar4 = (iVar3 != 1) + 5 + (uint)(iVar3 != 1);
          }
          iVar4 = sqlite3AuthCheck(pParse,iVar4,zName,pcVar10,zArg3_00);
          if (iVar4 == 0) {
            pcVar10 = "sqlite_master";
            if (iVar3 == 1) {
              pcVar10 = "sqlite_temp_master";
            }
            iVar3 = sqlite3AuthCheck(pParse,0x12,pcVar10,(char *)0x0,zArg3);
            if ((iVar3 == 0) &&
               (pTrigger = (Trigger *)sqlite3DbMallocRaw(db,0x48), pTrigger != (Trigger *)0x0)) {
              pTrigger->zName = (char *)0x0;
              pTrigger->table = (char *)0x0;
              pTrigger->pTabSchema = (Schema *)0x0;
              pTrigger->step_list = (TriggerStep *)0x0;
              pTrigger->pColumns = (IdList *)0x0;
              pTrigger->pSchema = (Schema *)0x0;
              pTrigger->op = '\0';
              pTrigger->tr_tm = '\0';
              *(undefined6 *)&pTrigger->field_0x12 = 0;
              pTrigger->pWhen = (Expr *)0x0;
              pTrigger->pNext = (Trigger *)0x0;
              pTrigger->zName = zName;
              pcVar10 = sqlite3DbStrDup(db,pTableName->a[0].zName);
              pTrigger->table = pcVar10;
              pTrigger->pSchema = *(Schema **)((long)&db->aDb->pSchema + local_78);
              pTrigger->pTabSchema = pTVar5->pSchema;
              pTrigger->op = (u8)op;
              pTrigger->tr_tm = '\x02' - (tr_tm == 0x23 || tr_tm == 0x31);
              zName = (char *)0x0;
              pEVar7 = exprDup(db,pWhen,1,(u8 **)0x0);
              pTrigger->pWhen = pEVar7;
              pIVar8 = sqlite3IdListDup(db,pColumns);
              pTrigger->pColumns = pIVar8;
              pParse->pNewTrigger = pTrigger;
              goto LAB_0014e810;
            }
          }
        }
      }
      else {
        pcVar10 = "AFTER";
        if (tr_tm == 0x23) {
          pcVar10 = "BEFORE";
        }
        sqlite3ErrorMsg(pParse,"cannot create %s trigger on view: %S",pcVar10,pTableName,0);
      }
    }
  }
  else {
    if (pName2->n != 0) {
      pcVar10 = "temporary trigger may not have qualified name";
LAB_0014e6d8:
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar10);
      goto LAB_0014e80c;
    }
    uVar11 = 1;
    local_80 = pName1;
    if (pTableName != (SrcList *)0x0) goto LAB_0014e73e;
LAB_0014e807:
    zName = (char *)0x0;
  }
LAB_0014e80c:
  pTrigger = (Trigger *)0x0;
LAB_0014e810:
  sqlite3DbFree(db,zName);
  sqlite3SrcListDelete(db,pTableName);
  sqlite3IdListDelete(db,pColumns);
  sqlite3ExprDelete(db,pWhen);
  if (pParse->pNewTrigger == (Trigger *)0x0) {
    sqlite3DeleteTrigger(db,pTrigger);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTrigger(
  Parse *pParse,      /* The parse context of the CREATE TRIGGER statement */
  Token *pName1,      /* The name of the trigger */
  Token *pName2,      /* The name of the trigger */
  int tr_tm,          /* One of TK_BEFORE, TK_AFTER, TK_INSTEAD */
  int op,             /* One of TK_INSERT, TK_UPDATE, TK_DELETE */
  IdList *pColumns,   /* column list if this is an UPDATE OF trigger */
  SrcList *pTableName,/* The name of the table/view the trigger applies to */
  Expr *pWhen,        /* WHEN clause */
  int isTemp,         /* True if the TEMPORARY keyword is present */
  int noErr           /* Suppress errors if the trigger already exists */
){
  Trigger *pTrigger = 0;  /* The new trigger */
  Table *pTab;            /* Table that the trigger fires off of */
  char *zName = 0;        /* Name of the trigger */
  sqlite3 *db = pParse->db;  /* The database connection */
  int iDb;                /* The database to store the trigger in */
  Token *pName;           /* The unqualified db name */
  DbFixer sFix;           /* State vector for the DB fixer */
  int iTabDb;             /* Index of the database holding pTab */

  assert( pName1!=0 );   /* pName1->z might be NULL, but not pName1 itself */
  assert( pName2!=0 );
  assert( op==TK_INSERT || op==TK_UPDATE || op==TK_DELETE );
  assert( op>0 && op<0xff );
  if( isTemp ){
    /* If TEMP was specified, then the trigger name may not be qualified. */
    if( pName2->n>0 ){
      sqlite3ErrorMsg(pParse, "temporary trigger may not have qualified name");
      goto trigger_cleanup;
    }
    iDb = 1;
    pName = pName1;
  }else{
    /* Figure out the db that the trigger will be created in */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ){
      goto trigger_cleanup;
    }
  }
  if( !pTableName || db->mallocFailed ){
    goto trigger_cleanup;
  }

  /* A long-standing parser bug is that this syntax was allowed:
  **
  **    CREATE TRIGGER attached.demo AFTER INSERT ON attached.tab ....
  **                                                 ^^^^^^^^
  **
  ** To maintain backwards compatibility, ignore the database
  ** name on pTableName if we are reparsing out of SQLITE_MASTER.
  */
  if( db->init.busy && iDb!=1 ){
    sqlite3DbFree(db, pTableName->a[0].zDatabase);
    pTableName->a[0].zDatabase = 0;
  }

  /* If the trigger name was unqualified, and the table is a temp table,
  ** then set iDb to 1 to create the trigger in the temporary database.
  ** If sqlite3SrcListLookup() returns 0, indicating the table does not
  ** exist, the error is caught by the block below.
  */
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( db->init.busy==0 && pName2->n==0 && pTab
        && pTab->pSchema==db->aDb[1].pSchema ){
    iDb = 1;
  }

  /* Ensure the table name matches database name and that the table exists */
  if( db->mallocFailed ) goto trigger_cleanup;
  assert( pTableName->nSrc==1 );
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", pName);
  if( sqlite3FixSrcList(&sFix, pTableName) ){
    goto trigger_cleanup;
  }
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( !pTab ){
    /* The table does not exist. */
    if( db->init.iDb==1 ){
      /* Ticket #3810.
      ** Normally, whenever a table is dropped, all associated triggers are
      ** dropped too.  But if a TEMP trigger is created on a non-TEMP table
      ** and the table is dropped by a different database connection, the
      ** trigger is not visible to the database connection that does the
      ** drop so the trigger cannot be dropped.  This results in an
      ** "orphaned trigger" - a trigger whose associated table is missing.
      */
      db->init.orphanTrigger = 1;
    }
    goto trigger_cleanup;
  }
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on virtual tables");
    goto trigger_cleanup;
  }

  /* Check that the trigger name is not reserved and that no trigger of the
  ** specified name exists */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName || SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto trigger_cleanup;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  if( sqlite3HashFind(&(db->aDb[iDb].pSchema->trigHash),zName) ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "trigger %T already exists", pName);
    }else{
      assert( !db->init.busy );
      sqlite3CodeVerifySchema(pParse, iDb);
    }
    goto trigger_cleanup;
  }

  /* Do not create a trigger on a system table */
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 ){
    sqlite3ErrorMsg(pParse, "cannot create trigger on system table");
    pParse->nErr++;
    goto trigger_cleanup;
  }

  /* INSTEAD of triggers are only for views and views only support INSTEAD
  ** of triggers.
  */
  if( pTab->pSelect && tr_tm!=TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create %s trigger on view: %S", 
        (tr_tm == TK_BEFORE)?"BEFORE":"AFTER", pTableName, 0);
    goto trigger_cleanup;
  }
  if( !pTab->pSelect && tr_tm==TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create INSTEAD OF"
        " trigger on table: %S", pTableName, 0);
    goto trigger_cleanup;
  }
  iTabDb = sqlite3SchemaToIndex(db, pTab->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_CREATE_TRIGGER;
    const char *zDb = db->aDb[iTabDb].zName;
    const char *zDbTrig = isTemp ? db->aDb[1].zName : zDb;
    if( iTabDb==1 || isTemp ) code = SQLITE_CREATE_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, zName, pTab->zName, zDbTrig) ){
      goto trigger_cleanup;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iTabDb),0,zDb)){
      goto trigger_cleanup;
    }
  }
#endif

  /* INSTEAD OF triggers can only appear on views and BEFORE triggers
  ** cannot appear on views.  So we might as well translate every
  ** INSTEAD OF trigger into a BEFORE trigger.  It simplifies code
  ** elsewhere.
  */
  if (tr_tm == TK_INSTEAD){
    tr_tm = TK_BEFORE;
  }

  /* Build the Trigger object */
  pTrigger = (Trigger*)sqlite3DbMallocZero(db, sizeof(Trigger));
  if( pTrigger==0 ) goto trigger_cleanup;
  pTrigger->zName = zName;
  zName = 0;
  pTrigger->table = sqlite3DbStrDup(db, pTableName->a[0].zName);
  pTrigger->pSchema = db->aDb[iDb].pSchema;
  pTrigger->pTabSchema = pTab->pSchema;
  pTrigger->op = (u8)op;
  pTrigger->tr_tm = tr_tm==TK_BEFORE ? TRIGGER_BEFORE : TRIGGER_AFTER;
  pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
  pTrigger->pColumns = sqlite3IdListDup(db, pColumns);
  assert( pParse->pNewTrigger==0 );
  pParse->pNewTrigger = pTrigger;

trigger_cleanup:
  sqlite3DbFree(db, zName);
  sqlite3SrcListDelete(db, pTableName);
  sqlite3IdListDelete(db, pColumns);
  sqlite3ExprDelete(db, pWhen);
  if( !pParse->pNewTrigger ){
    sqlite3DeleteTrigger(db, pTrigger);
  }else{
    assert( pParse->pNewTrigger==pTrigger );
  }
}